

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

void __thiscall icu_63::TimeZoneFormat::checkAbuttingHoursAndMinutes(TimeZoneFormat *this)

{
  UVector *this_00;
  void *pvVar1;
  int32_t index;
  long lVar2;
  bool bVar3;
  
  this->fAbuttingOffsetHoursAndMinutes = '\0';
  lVar2 = 0;
  do {
    this_00 = this->fGMTOffsetPatternItems[lVar2];
    if (0 < this_00->count) {
      index = 0;
      bVar3 = false;
      do {
        pvVar1 = UVector::elementAt(this_00,index);
        if (*(int *)((long)pvVar1 + 0x10) == 0) {
          if (bVar3) break;
          bVar3 = false;
        }
        else {
          if (bVar3) {
            this->fAbuttingOffsetHoursAndMinutes = '\x01';
            return;
          }
          bVar3 = *(int *)((long)pvVar1 + 0x10) == 1;
        }
        index = index + 1;
      } while (index < this_00->count);
      if (this->fAbuttingOffsetHoursAndMinutes != '\0') {
        return;
      }
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void
TimeZoneFormat::checkAbuttingHoursAndMinutes() {
    fAbuttingOffsetHoursAndMinutes= FALSE;
    for (int32_t type = 0; type < UTZFMT_PAT_COUNT; type++) {
        UBool afterH = FALSE;
        UVector *items = fGMTOffsetPatternItems[type];
        for (int32_t i = 0; i < items->size(); i++) {
            const GMTOffsetField* item = (GMTOffsetField*)items->elementAt(i);
            GMTOffsetField::FieldType fieldType = item->getType();
            if (fieldType != GMTOffsetField::TEXT) {
                if (afterH) {
                    fAbuttingOffsetHoursAndMinutes = TRUE;
                    break;
                } else if (fieldType == GMTOffsetField::HOUR) {
                    afterH = TRUE;
                }
            } else if (afterH) {
                break;
            }
        }
        if (fAbuttingOffsetHoursAndMinutes) {
            break;
        }
    }
}